

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::UTF8CollationIterator::handleNextCE32
          (UTF8CollationIterator *this,UChar32 *c,UErrorCode *param_2)

{
  int iVar1;
  byte bVar2;
  UChar32 UVar3;
  uint32_t ce32;
  uint8_t t2;
  uint8_t t1;
  UErrorCode *param_2_local;
  UChar32 *c_local;
  UTF8CollationIterator *this_local;
  
  if (this->pos == this->length) {
    *c = -1;
    this_local._4_4_ = 0xc0;
  }
  else {
    iVar1 = this->pos;
    this->pos = iVar1 + 1;
    *c = (uint)this->u8[iVar1];
    if ((*c & 0x80U) == 0) {
      this_local._4_4_ = ((this->super_CollationIterator).trie)->data32[*c];
    }
    else if ((((*c < 0xe0) || (0xef < *c)) ||
             ((this->length <= this->pos + 1 && (-1 < this->length)))) ||
            ((((int)" 000000000000\x1000"[(int)(*c & 0xf)] &
              1 << (sbyte)((int)(uint)this->u8[this->pos] >> 5)) == 0 ||
             (bVar2 = this->u8[this->pos + 1] + 0x80, 0x3f < bVar2)))) {
      if ((*c < 0xe0) &&
         (((0xc1 < *c && (this->pos != this->length)) &&
          (bVar2 = this->u8[this->pos] + 0x80, bVar2 < 0x40)))) {
        this_local._4_4_ =
             ((this->super_CollationIterator).trie)->data32
             [(int)((uint)((this->super_CollationIterator).trie)->index[*c + 0x760] + (uint)bVar2)];
        *c = (*c & 0x1fU) << 6 | (uint)bVar2;
        this->pos = this->pos + 1;
      }
      else {
        UVar3 = utf8_nextCharSafeBody_63(this->u8,&this->pos,this->length,*c,-3);
        *c = UVar3;
        this_local._4_4_ = CollationData::getCE32((this->super_CollationIterator).data,*c);
      }
    }
    else {
      *c = (*c & 0xfU) << 0xc | (this->u8[this->pos] & 0x3f) << 6 | (uint)bVar2;
      this->pos = this->pos + 2;
      this_local._4_4_ =
           ((this->super_CollationIterator).trie)->data32
           [(int)((uint)((this->super_CollationIterator).trie)->index[*c >> 5] * 4 + (*c & 0x1fU))];
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
UTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode & /*errorCode*/) {
    if(pos == length) {
        c = U_SENTINEL;
        return Collation::FALLBACK_CE32;
    }
    // Optimized combination of U8_NEXT_OR_FFFD() and UTRIE2_U8_NEXT32().
    c = u8[pos++];
    if(U8_IS_SINGLE(c)) {
        // ASCII 00..7F
        return trie->data32[c];
    }
    uint8_t t1, t2;
    if(0xe0 <= c && c < 0xf0 &&
            ((pos + 1) < length || length < 0) &&
            U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
            (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
        // U+0800..U+FFFF except surrogates
        c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
        pos += 2;
        return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
    } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
        // U+0080..U+07FF
        uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
        c = ((c & 0x1f) << 6) | t1;
        ++pos;
        return ce32;
    } else {
        // Function call for supplementary code points and error cases.
        // Illegal byte sequences yield U+FFFD.
        c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
        return data->getCE32(c);
    }
}